

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O3

int handle_observation_definition(ingest_info *info,char *line)

{
  byte bVar1;
  int iVar2;
  coda_type_record *pcVar3;
  coda_type_record_field *pcVar4;
  long lVar5;
  coda_mem_record *pcVar6;
  coda_mem_data *pcVar7;
  void *pvVar8;
  long lVar9;
  coda_type_array *type;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  char str [4];
  int64_t num_types;
  undefined2 local_74;
  char local_72;
  undefined1 local_71;
  int16_t local_70;
  undefined6 uStack_6e;
  coda_mem_array *local_68;
  coda_mem_record *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  long local_40;
  long local_38;
  
  bVar1 = *line;
  if (bVar1 < 0x52) {
    if (bVar1 == 0x45) {
      pcVar14 = "galileo";
      lVar13 = 0x78;
    }
    else {
      if (bVar1 != 0x47) {
LAB_0012aaf0:
        coda_set_error(-0x16,
                       "invalid satellite system for observation type definition (line: %ld, byte offset: %ld)"
                       ,info->linenumber,info->offset);
        return -1;
      }
      pcVar14 = "gps";
      lVar13 = 0x18;
    }
  }
  else if (bVar1 == 0x53) {
    pcVar14 = "sbas";
    lVar13 = 0xa8;
  }
  else {
    if (bVar1 != 0x52) goto LAB_0012aaf0;
    pcVar14 = "glonass";
    lVar13 = 0x48;
  }
  if (*(long *)((long)&info->header + lVar13) == 0) {
    pcVar3 = coda_type_record_new(coda_format_rinex);
    *(coda_type_record **)((long)&info->header + lVar13) = pcVar3;
    pcVar4 = coda_type_record_field_new("number");
    coda_type_record_field_set_type
              (pcVar4,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x118) + 0x180));
    coda_type_record_add_field(*(coda_type_record **)((long)&info->header + lVar13),pcVar4);
    lVar5 = coda_ascii_parse_int64(line + 3,3,(int64_t *)&local_70,0);
    if (-1 < lVar5) {
      pcVar6 = coda_mem_record_new(*(coda_type_record **)(*(long *)(in_FS_OFFSET + -0x118) + 0xf8),
                                   (coda_dynamic_type *)0x0);
      pcVar7 = coda_mem_char_new(*(coda_type_text **)(*(long *)(in_FS_OFFSET + -0x118) + 0xd8),
                                 (coda_dynamic_type *)0x0,info->product,*line);
      coda_mem_record_add_field(pcVar6,"code",(coda_dynamic_type *)pcVar7,0);
      pcVar7 = coda_mem_int16_new(*(coda_type_number **)(*(long *)(in_FS_OFFSET + -0x118) + 0xe0),
                                  (coda_dynamic_type *)0x0,info->product,local_70);
      local_60 = pcVar6;
      coda_mem_record_add_field(pcVar6,"num_obs_types",(coda_dynamic_type *)pcVar7,0);
      local_68 = coda_mem_array_new(*(coda_type_array **)(*(long *)(in_FS_OFFSET + -0x118) + 0xf0),
                                    (coda_dynamic_type *)0x0);
      lVar5 = CONCAT62(uStack_6e,local_70);
      pvVar8 = malloc(lVar5 * 8);
      *(void **)((long)&info->product + lVar13) = pvVar8;
      if (pvVar8 == (void *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",lVar5 * 8,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-rinex.c"
                       ,0x776);
        return -1;
      }
      *(int *)((long)&info->f + lVar13) = (int)lVar5;
      local_58 = line;
      local_50 = pcVar14;
      if (0 < lVar5) {
        lVar9 = 0;
        do {
          *(undefined8 *)(*(long *)((long)&info->product + lVar13) + lVar9 * 8) = 0;
          lVar9 = lVar9 + 1;
        } while (lVar5 != lVar9);
        if (0 < lVar5) {
          local_48 = line + 7;
          iVar11 = 0;
          lVar9 = 0;
          uVar15 = 0;
          lVar5 = 0;
          local_40 = lVar13;
          do {
            local_38 = lVar5 + -1;
            iVar12 = (int)((uVar15 & 0xffffffff) / 0xd);
            if ((lVar5 != 0) && (iVar12 * -0xd == (int)lVar5)) {
              lVar13 = ftell((FILE *)info->f);
              info->offset = lVar13;
              info->linenumber = info->linenumber + 1;
              iVar2 = get_line(info->f,local_58);
              if (iVar2 < 0) {
                coda_dynamic_type_delete((coda_dynamic_type *)local_60);
                coda_dynamic_type_delete((coda_dynamic_type *)local_68);
                return -1;
              }
              lVar5 = lVar5 + CONCAT62(uStack_6e,local_70);
              lVar13 = 0x3a;
              if (lVar5 < 0xd) {
                uVar10 = SUB168(SEXT816(lVar5) * SEXT816(0x4ec4ec4ec4ec4ec5),8);
                lVar13 = (lVar5 + ((uVar10 >> 2) - ((long)uVar10 >> 0x3f)) * -0xd) * 4 + 6;
              }
              if (iVar2 < lVar13) {
                coda_set_error(-0x16,
                               "header line length (%ld) too short (line: %ld, byte offset: %ld)",
                               (long)iVar2,info->linenumber,info->offset);
                return -1;
              }
            }
            uVar10 = (ulong)(uint)(iVar11 + iVar12 * -0x34);
            local_72 = local_48[uVar10 + 2];
            local_74 = *(undefined2 *)(local_48 + uVar10);
            local_71 = 0;
            pcVar7 = coda_mem_string_new(*(coda_type_text **)
                                          (*(long *)(in_FS_OFFSET + -0x118) + 0xe8),
                                         (coda_dynamic_type *)0x0,info->product,(char *)&local_74);
            coda_mem_array_add_element(local_68,(coda_dynamic_type *)pcVar7);
            pcVar4 = coda_type_record_field_new((char *)&local_74);
            coda_type_record_field_set_type
                      (pcVar4,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x118) + 0x1a0));
            lVar13 = local_40;
            coda_type_record_add_field
                      (*(coda_type_record **)((long)&info->header + local_40),pcVar4);
            pcVar14 = strdup((char *)&local_74);
            *(char **)(*(long *)((long)&info->product + lVar13) + lVar9) = pcVar14;
            if (*(long *)(*(long *)((long)&info->product + lVar13) + lVar9) == 0) {
              coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                             "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-rinex.c"
                             ,0x7ab);
              return -1;
            }
            uVar15 = uVar15 + 1;
            lVar9 = lVar9 + 8;
            iVar11 = iVar11 + 4;
            lVar5 = local_38;
          } while ((long)uVar15 < CONCAT62(uStack_6e,local_70));
        }
      }
      pcVar6 = local_60;
      coda_mem_record_add_field(local_60,"descriptor",(coda_dynamic_type *)local_68,0);
      coda_mem_array_add_element(info->sys_array,(coda_dynamic_type *)pcVar6);
      type = coda_type_array_new(coda_format_rinex);
      *(coda_type_array **)((long)&(info->gps).num_observables + lVar13) = type;
      coda_type_array_add_variable_dimension(type,(coda_expression *)0x0);
      coda_type_array_set_base_type
                (*(coda_type_array **)((long)&(info->gps).num_observables + lVar13),
                 *(coda_type **)((long)&info->header + lVar13));
      pcVar4 = coda_type_record_field_new(local_50);
      coda_type_record_field_set_type
                (pcVar4,*(coda_type **)((long)&(info->gps).num_observables + lVar13));
      coda_type_record_add_field(info->epoch_record_definition,pcVar4);
      return 0;
    }
    coda_add_error_message(" (line: %ld, byte offset: %ld)",info->linenumber,info->offset + 3);
  }
  else {
    coda_set_error(-0x16,
                   "multiple observation type definitions for type \'%c\' (line: %ld, byte offset: %ld)"
                   ,(ulong)bVar1,info->linenumber,info->offset);
  }
  return -1;
}

Assistant:

static int handle_observation_definition(ingest_info *info, char *line)
{
    satellite_info *sat_info;
    coda_type_record_field *field;
    coda_dynamic_type *value;
    coda_mem_record *sys;
    coda_mem_array *descriptor_array;
    const char *fieldname = NULL;
    int64_t num_types;
    int i;

    switch (line[0])
    {
        case 'G':      /* GPS */
            sat_info = &info->gps;
            fieldname = "gps";
            break;
        case 'R':      /* GLONASS */
            sat_info = &info->glonass;
            fieldname = "glonass";
            break;
        case 'E':      /* Galileo */
            sat_info = &info->galileo;
            fieldname = "galileo";
            break;
        case 'S':      /* SBAS */
            sat_info = &info->sbas;
            fieldname = "sbas";
            break;
        default:
            coda_set_error(CODA_ERROR_FILE_READ, "invalid satellite system for observation type definition "
                           "(line: %ld, byte offset: %ld)", info->linenumber, info->offset);
            return -1;
    }

    if (sat_info->sat_obs_definition != NULL)
    {
        coda_set_error(CODA_ERROR_FILE_READ, "multiple observation type definitions for type '%c' "
                       "(line: %ld, byte offset: %ld)", line[0], info->linenumber, info->offset);
        return -1;
    }
    sat_info->sat_obs_definition = coda_type_record_new(coda_format_rinex);
    field = coda_type_record_field_new("number");
    coda_type_record_field_set_type(field, rinex_type[rinex_satellite_number]);
    coda_type_record_add_field(sat_info->sat_obs_definition, field);

    if (coda_ascii_parse_int64(&line[3], 3, &num_types, 0) < 0)
    {
        coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset + 3);
        return -1;
    }
    sys = coda_mem_record_new((coda_type_record *)rinex_type[rinex_sys], NULL);
    value = (coda_dynamic_type *)coda_mem_char_new((coda_type_text *)rinex_type[rinex_sys_code], NULL, info->product,
                                                   line[0]);
    coda_mem_record_add_field(sys, "code", value, 0);
    value = (coda_dynamic_type *)coda_mem_int16_new((coda_type_number *)rinex_type[rinex_sys_num_obs_types],
                                                    NULL, info->product, (int16_t)num_types);
    coda_mem_record_add_field(sys, "num_obs_types", value, 0);
    descriptor_array = coda_mem_array_new((coda_type_array *)rinex_type[rinex_sys_descriptor_array], NULL);

    sat_info->observable = malloc((size_t)num_types * sizeof(char *));
    if (sat_info->observable == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)num_types * sizeof(char *), __FILE__, __LINE__);
        return -1;
    }
    sat_info->num_observables = (int)num_types;
    for (i = 0; i < num_types; i++)
    {
        sat_info->observable[i] = NULL;
    }

    for (i = 0; i < num_types; i++)
    {
        char str[4];

        if (i % 13 == 0 && i > 0)
        {
            long linelength;
            long expected_line_length = 6 + 13 * 4;

            /* read next line */
            info->offset = ftell(info->f);
            info->linenumber++;
            linelength = get_line(info->f, line);
            if (linelength < 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)sys);
                coda_dynamic_type_delete((coda_dynamic_type *)descriptor_array);
                return -1;
            }
            if (num_types - i < 13)
            {
                expected_line_length = 6 + ((num_types - i) % 13) * 4;
            }
            if (linelength < expected_line_length)
            {
                coda_set_error(CODA_ERROR_FILE_READ, "header line length (%ld) too short (line: %ld, byte offset: %ld)",
                               linelength, info->linenumber, info->offset);
                return -1;
            }
        }
        memcpy(str, &line[6 + (i % 13) * 4 + 1], 3);
        str[3] = '\0';
        value = (coda_dynamic_type *)coda_mem_string_new((coda_type_text *)rinex_type[rinex_sys_descriptor], NULL,
                                                         info->product, str);
        coda_mem_array_add_element(descriptor_array, value);

        field = coda_type_record_field_new(str);
        coda_type_record_field_set_type(field, rinex_type[rinex_observation_record]);
        coda_type_record_add_field(sat_info->sat_obs_definition, field);

        sat_info->observable[i] = strdup(str);
        if (sat_info->observable[i] == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
    }

    /* update header */
    coda_mem_record_add_field(sys, "descriptor", (coda_dynamic_type *)descriptor_array, 0);
    coda_mem_array_add_element(info->sys_array, (coda_dynamic_type *)sys);

    /* update epoch record definition */
    sat_info->sat_obs_array_definition = coda_type_array_new(coda_format_rinex);
    coda_type_array_add_variable_dimension((coda_type_array *)sat_info->sat_obs_array_definition, NULL);
    coda_type_array_set_base_type(sat_info->sat_obs_array_definition, (coda_type *)sat_info->sat_obs_definition);

    field = coda_type_record_field_new(fieldname);
    coda_type_record_field_set_type(field, (coda_type *)sat_info->sat_obs_array_definition);
    coda_type_record_add_field(info->epoch_record_definition, field);

    return 0;
}